

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O3

void __thiscall CountOverJoin::~CountOverJoin(CountOverJoin *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountOverJoin_00143c20;
  p_Var1 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pcVar2 = (this->_pathToFiles)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->_pathToFiles).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

CountOverJoin::~CountOverJoin(){}